

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.cpp
# Opt level: O3

void __thiscall jaegertracing::ThriftVisitor::setString(ThriftVisitor *this,string_view value)

{
  Tag *this_00;
  string local_48;
  
  thrift::Tag::__set_vType(this->_tag,STRING);
  this_00 = this->_tag;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,value.data_,value.data_ + value.length_);
  thrift::Tag::__set_vStr(this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void setString(opentracing::string_view value) const
    {
        _tag.__set_vType(thrift::TagType::STRING);
        _tag.__set_vStr(value);
    }